

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpScanner.cpp
# Opt level: O2

int __thiscall glslang::TPpContext::lFloatConst(TPpContext *this,int len,int ch,TPpToken *ppToken)

{
  char *__s;
  EShSource EVar1;
  TParseContextBase *pTVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  longlong lVar7;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  char cVar18;
  int iVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  double expFactor;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  uint local_bc;
  undefined8 local_b8;
  int local_94;
  allocator<char> local_81;
  long local_80;
  TString numstr;
  pool_allocator<char> local_50 [4];
  
  __s = ppToken->name;
  uVar5 = 0;
  uVar10 = 0;
  if (0 < len) {
    uVar10 = (ulong)(uint)len;
  }
  for (; uVar10 != uVar5; uVar5 = uVar5 + 1) {
    if (ppToken->name[uVar5] != '0') {
      uVar10 = uVar5 & 0xffffffff;
      break;
    }
  }
  lVar6 = (long)len;
  uVar15 = (uint)uVar10;
  lVar11 = (long)(int)uVar15;
  uVar16 = len;
  if ((int)uVar15 < len) {
    uVar16 = uVar15;
  }
  uVar13 = len + 1;
  lVar17 = lVar6;
  do {
    uVar14 = uVar16;
    if (lVar17 <= lVar11) break;
    uVar13 = uVar13 - 1;
    lVar3 = lVar17 + -1;
    lVar17 = lVar17 + -1;
    uVar14 = uVar13;
  } while (ppToken->name[lVar3] == '0');
  local_94 = uVar14 - uVar15;
  bVar8 = local_94 < 0x10;
  if (local_94 < 0x10) {
    lVar17 = 0;
    for (; lVar11 < (int)uVar14; lVar11 = lVar11 + 1) {
      lVar17 = lVar17 * 10 + (long)__s[lVar11] + -0x30;
    }
  }
  else {
    lVar17 = 0;
  }
  iVar9 = len - uVar14;
  bVar20 = ch == 0x2e;
  local_bc = len;
  if (bVar20) {
    if (len < 0x401) {
      len = len + 1;
      __s[lVar6] = '.';
    }
    ch = (*(this->inputStack).
           super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
    if (ch == 0x23) {
      if ((this->ifdepth < 1) &&
         (((this->parseContext->super_TParseVersions).intermediate)->source != EShSourceHlsl)) {
        ch = 0x23;
      }
      else {
        ch = 0x23;
        pcVar12 = "unexpected use of";
        if (1 < len) {
          if (len == 3) {
            if (((ppToken->name[1] == '1') || (*__s == '-')) || (*__s == '+')) goto LAB_0030c87b;
          }
          else if ((len == 2) && (*__s == '1')) {
LAB_0030c87b:
            ch = (*(this->inputStack).
                   super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
            pcVar12 = "expected \'INF\'";
            if (ch == 0x49) {
              ch = (*(this->inputStack).
                     super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
              if ((ch == 0x4e) &&
                 (ch = (*(this->inputStack).
                         super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])(),
                 ch == 0x46)) {
                builtin_strncpy(ppToken->name + (uint)len,"INF",4);
                if (ppToken->name[0] == '-') {
                  lVar7 = -0x10000000000000;
                }
                else {
                  lVar7 = 0x7ff0000000000000;
                }
                (ppToken->field_3).i64val = lVar7;
                return 0x9e;
              }
              pcVar12 = "expected \'INF\'";
            }
          }
        }
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,pcVar12,"#","");
      }
    }
    local_80 = (long)(int)uVar14;
    uVar16 = len;
    while (local_bc = uVar16, uVar15 = uVar16, ch == 0x30) {
      if ((int)uVar16 < 0x401) {
        lVar6 = (long)(int)uVar16;
        uVar16 = uVar16 + 1;
        __s[lVar6] = '0';
      }
      ch = (*(this->inputStack).
             super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
    }
    while (ch - 0x30U < 10) {
      if ((int)local_bc < 0x401) {
        lVar6 = (long)(int)local_bc;
        local_bc = local_bc + 1;
        __s[lVar6] = (char)ch;
      }
      if (ch != 0x30) {
        uVar15 = local_bc;
      }
      ch = (*(this->inputStack).
             super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
    }
    if ((int)uVar16 < (int)uVar15) {
      bVar21 = local_94 < 0x10;
      local_94 = local_94 + ~uVar14 + uVar15;
      bVar8 = local_94 < 0x10 && bVar21;
      local_b8 = lVar17;
      if (local_94 < 0x10 && bVar21) {
        for (lVar6 = local_80; lVar6 < (int)uVar15; lVar6 = lVar6 + 1) {
          if ((long)__s[lVar6] != 0x2e) {
            local_b8 = local_b8 * 10 + -0x30 + (long)__s[lVar6];
          }
        }
      }
      iVar9 = len - uVar15;
      lVar17 = local_b8;
    }
  }
  iVar19 = 0;
  if ((ch & 0xffffffdfU) == 0x45) {
    if ((int)local_bc < 0x401) {
      lVar6 = (long)(int)local_bc;
      local_bc = local_bc + 1;
      __s[lVar6] = (char)ch;
    }
    ch = (*(this->inputStack).
           super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
    if ((ch == 0x2d) || (ch == 0x2b)) {
      bVar21 = ch == 0x2d;
      if ((int)local_bc < 0x401) {
        lVar6 = (long)(int)local_bc;
        local_bc = local_bc + 1;
        __s[lVar6] = (char)ch;
      }
      ch = (*(this->inputStack).
             super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
    }
    else {
      bVar21 = false;
    }
    if (ch - 0x30U < 10) {
      iVar19 = 0;
      while (ch - 0x30U < 10) {
        if (iVar19 < 500) {
          iVar19 = (ch - 0x30U) + iVar19 * 10;
        }
        if ((int)local_bc < 0x401) {
          lVar6 = (long)(int)local_bc;
          local_bc = local_bc + 1;
          __s[lVar6] = (char)ch;
        }
        ch = (*(this->inputStack).
               super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
      }
    }
    else {
      iVar19 = 0;
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"bad character in float exponent","","");
    }
    bVar20 = true;
    if (!bVar21) goto LAB_0030cbac;
    uVar15 = iVar19 - iVar9;
  }
  else {
    bVar21 = false;
LAB_0030cbac:
    uVar16 = iVar19 + iVar9;
    bVar22 = true;
    if (-1 < (int)uVar16) {
      bVar22 = bVar21;
    }
    bVar21 = bVar22;
    uVar15 = -uVar16;
    if (0 < (int)uVar16) {
      uVar15 = uVar16;
    }
  }
  bVar8 = (bool)(bVar8 & (int)uVar15 < 0x17);
  dVar26 = 0.0;
  if (bVar8) {
    if ((int)uVar15 < 1) {
      dVar26 = 1.0;
    }
    else {
      dVar23 = 10.0;
      dVar26 = 1.0;
      for (; uVar15 != 0; uVar15 = uVar15 >> 1) {
        if ((uVar15 & 1) != 0) {
          dVar26 = dVar26 * dVar23;
        }
        dVar23 = dVar23 * dVar23;
      }
      uVar15 = 0;
    }
  }
  uVar16 = ch & 0xffffffdf;
  cVar18 = (char)ch;
  if (uVar16 == 0x46) {
    if ((this->ifdepth == 0) &&
       (TParseVersions::profileRequires
                  (&this->parseContext->super_TParseVersions,&ppToken->loc,8,300,(char *)0x0,
                   "floating-point suffix"), this->ifdepth == 0)) {
      if (((this->parseContext->super_TParseVersions).messages & EShMsgRelaxedErrors) ==
          EShMsgDefault) {
        TParseVersions::profileRequires
                  (&this->parseContext->super_TParseVersions,&ppToken->loc,-9,0x78,(char *)0x0,
                   "floating-point suffix");
        bVar22 = this->ifdepth != 0;
      }
      else {
        bVar22 = false;
      }
      if (!bVar20 && !bVar22) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,"float literal needs a decimal point or exponent","",
                   "");
      }
    }
    if ((int)local_bc < 0x401) {
      lVar6 = (long)(int)local_bc;
      local_bc = local_bc + 1;
      __s[lVar6] = cVar18;
      goto LAB_0030d014;
    }
    iVar9 = 0;
LAB_0030d036:
    bVar20 = false;
  }
  else {
    if (uVar16 == 0x48) {
      if (this->ifdepth == 0) {
        pTVar2 = this->parseContext;
        if (((pTVar2->super_TParseVersions).intermediate)->source == EShSourceGlsl) {
          (*(pTVar2->super_TParseVersions)._vptr_TParseVersions[0x12])
                    (pTVar2,ppToken,"half floating-point suffix",0);
          bVar22 = this->ifdepth != 0;
        }
        else {
          bVar22 = false;
        }
        if (!bVar20 && !bVar22) {
          (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                    (this->parseContext,ppToken,"float literal needs a decimal point or exponent",""
                     ,"");
        }
      }
      EVar1 = ((this->parseContext->super_TParseVersions).intermediate)->source;
      if (EVar1 == EShSourceHlsl) {
        if (0x400 < (int)local_bc) {
LAB_0030ce9b:
          iVar9 = 1;
          goto LAB_0030d036;
        }
        lVar6 = (long)(int)local_bc;
        local_bc = local_bc + 1;
        __s[lVar6] = cVar18;
LAB_0030ce8e:
        iVar9 = 1;
        bVar20 = false;
      }
      else {
        if (EVar1 != EShSourceGlsl) goto LAB_0030d014;
        uVar16 = (*(this->inputStack).
                   super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
        if ((uVar16 & 0xffffffdf) == 0x46) {
          if ((int)local_bc < 0x401) {
            __s[(int)local_bc] = cVar18;
            if (local_bc != 0x400) {
              __s[(long)(int)local_bc + 1] = (char)uVar16;
              local_bc = local_bc + 2;
              goto LAB_0030ce8e;
            }
          }
          goto LAB_0030ce9b;
        }
LAB_0030cf58:
        (*(this->inputStack).
          super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[4])();
        (*(this->inputStack).
          super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[4])();
        bVar20 = false;
        iVar9 = 0;
      }
    }
    else {
      if (uVar16 == 0x4c) {
        if (this->ifdepth == 0) {
          pTVar2 = this->parseContext;
          if (((pTVar2->super_TParseVersions).intermediate)->source == EShSourceGlsl) {
            (*(pTVar2->super_TParseVersions)._vptr_TParseVersions[0x11])
                      (pTVar2,ppToken,"double floating-point suffix");
            bVar22 = this->ifdepth != 0;
          }
          else {
            bVar22 = false;
          }
          if (!bVar20 && !bVar22) {
            (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                      (this->parseContext,ppToken,"float literal needs a decimal point or exponent",
                       "","");
          }
        }
        EVar1 = ((this->parseContext->super_TParseVersions).intermediate)->source;
        if (EVar1 != EShSourceHlsl) {
          if (EVar1 == EShSourceGlsl) {
            uVar16 = (*(this->inputStack).
                       super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
            if ((uVar16 & 0xffffffdf) != 0x46) goto LAB_0030cf58;
            if ((int)local_bc < 0x401) {
              __s[(int)local_bc] = cVar18;
              if (local_bc != 0x400) {
                uVar13 = local_bc + 2;
                __s[(long)(int)local_bc + 1] = (char)uVar16;
                goto LAB_0030cfb1;
              }
            }
            goto LAB_0030cfb9;
          }
          goto LAB_0030d014;
        }
        if (0x400 < (int)local_bc) {
LAB_0030cfb9:
          bVar20 = true;
          iVar9 = 0;
          goto LAB_0030d03d;
        }
        uVar13 = local_bc + 1;
        __s[(int)local_bc] = cVar18;
LAB_0030cfb1:
        bVar20 = true;
        local_bc = uVar13;
      }
      else {
        (*(this->inputStack).
          super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[4])();
LAB_0030d014:
        bVar20 = false;
      }
      iVar9 = 0;
    }
    if ((int)local_bc < 0x401) goto LAB_0030d075;
  }
LAB_0030d03d:
  (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
            (this->parseContext,ppToken,"float literal too long","","");
  local_bc = 0x400;
LAB_0030d075:
  __s[(int)local_bc] = '\0';
  local_b8._4_4_ = (undefined4)((ulong)lVar17 >> 0x20);
  if (bVar8) {
    if ((dVar26 != 0.0) || (NAN(dVar26))) {
      auVar25._8_4_ = local_b8._4_4_;
      auVar25._0_8_ = lVar17;
      auVar25._12_4_ = 0x45300000;
      dVar23 = (auVar25._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0);
      if (bVar21) {
        (ppToken->field_3).dval = dVar23 / dVar26;
      }
      else {
        (ppToken->field_3).dval = dVar26 * dVar23;
      }
    }
    else {
      auVar24._8_4_ = local_b8._4_4_;
      auVar24._0_8_ = lVar17;
      auVar24._12_4_ = 0x45300000;
      (ppToken->field_3).dval =
           (auVar24._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0);
    }
  }
  else {
    (ppToken->field_3).dval = 0.0;
    local_50[0].allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&numstr,
               __s,local_50);
    bVar4 = numstr._M_dataplus._M_p[numstr._M_string_length - 1];
    if ((bVar4 | 0x20) == 0x66) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      pop_back(&numstr);
      bVar4 = numstr._M_dataplus._M_p[numstr._M_string_length - 1];
    }
    if ((bVar4 | 0x20) == 0x68) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      pop_back(&numstr);
      bVar4 = numstr._M_dataplus._M_p[numstr._M_string_length - 1];
    }
    if ((bVar4 | 0x20) == 0x6c) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      pop_back(&numstr);
    }
    std::ios::clear((int)*(undefined8 *)(*(long *)&this->strtodStream + -0x18) +
                    (int)&this->strtodStream);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,numstr._M_dataplus._M_p,&local_81);
    std::__cxx11::stringbuf::str((string *)&this->field_0x258);
    std::__cxx11::string::_M_dispose();
    std::istream::_M_extract<double>((double *)&this->strtodStream);
    if (((&this->field_0x268)[*(long *)(*(long *)&this->strtodStream + -0x18)] & 5) != 0) {
      if ((!bVar21) && (300 < (int)(uVar15 + local_94))) {
        (ppToken->field_3).i64val = 0x7ff0000000000000;
      }
      if ((bVar21) && (300 < (int)(uVar15 + local_94))) {
        (ppToken->field_3).dval = 0.0;
      }
    }
  }
  iVar19 = 0x9f;
  if (!bVar20) {
    iVar19 = iVar9 * 2 + 0x9e;
  }
  return iVar19;
}

Assistant:

int TPpContext::lFloatConst(int len, int ch, TPpToken* ppToken)
{
    const auto saveName = [&](int ch) {
        if (len <= MaxTokenLength)
            ppToken->name[len++] = static_cast<char>(ch);
    };

    // find the range of non-zero digits before the decimal point
    int startNonZero = 0;
    while (startNonZero < len && ppToken->name[startNonZero] == '0')
        ++startNonZero;
    int endNonZero = len;
    while (endNonZero > startNonZero && ppToken->name[endNonZero-1] == '0')
        --endNonZero;
    int numWholeNumberDigits = endNonZero - startNonZero;

    // accumulate the range's value
    bool fastPath = numWholeNumberDigits <= 15;  // when the number gets too complex, set to false
    unsigned long long wholeNumber = 0;
    if (fastPath) {
        for (int i = startNonZero; i < endNonZero; ++i)
            wholeNumber = wholeNumber * 10 + (ppToken->name[i] - '0');
    }
    int decimalShift = len - endNonZero;

    // Decimal point:
    bool hasDecimalOrExponent = false;
    if (ch == '.') {
        hasDecimalOrExponent = true;
        saveName(ch);
        ch = getChar();
        int firstDecimal = len;

#ifdef ENABLE_HLSL
        // 1.#INF or -1.#INF
        if (ch == '#' && (ifdepth > 0 || parseContext.intermediate.getSource() == EShSourceHlsl)) {
            if ((len <  2) ||
                (len == 2 && ppToken->name[0] != '1') ||
                (len == 3 && ppToken->name[1] != '1' && !(ppToken->name[0] == '-' || ppToken->name[0] == '+')) ||
                (len >  3))
                parseContext.ppError(ppToken->loc, "unexpected use of", "#", "");
            else {
                // we have 1.# or -1.# or +1.#, check for 'INF'
                if ((ch = getChar()) != 'I' ||
                    (ch = getChar()) != 'N' ||
                    (ch = getChar()) != 'F')
                    parseContext.ppError(ppToken->loc, "expected 'INF'", "#", "");
                else {
                    // we have [+-].#INF, and we are targeting IEEE 754, so wrap it up:
                    saveName('I');
                    saveName('N');
                    saveName('F');
                    ppToken->name[len] = '\0';
                    if (ppToken->name[0] == '-')
                        ppToken->i64val = 0xfff0000000000000; // -Infinity
                    else
                        ppToken->i64val = 0x7ff0000000000000; // +Infinity
                    return PpAtomConstFloat;
                }
            }
        }
#endif

        // Consume leading-zero digits after the decimal point
        while (ch == '0') {
            saveName(ch);
            ch = getChar();
        }
        int startNonZeroDecimal = len;
        int endNonZeroDecimal = len;

        // Consume remaining digits, up to the exponent
        while (ch >= '0' && ch <= '9') {
            saveName(ch);
            if (ch != '0')
                endNonZeroDecimal = len;
            ch = getChar();
        }

        // Compute accumulation up to the last non-zero digit
        if (endNonZeroDecimal > startNonZeroDecimal) {
            numWholeNumberDigits += endNonZeroDecimal - endNonZero - 1; // don't include the "."
            if (numWholeNumberDigits > 15)
                fastPath = false;
            if (fastPath) {
                for (int i = endNonZero; i < endNonZeroDecimal; ++i) {
                    if (ppToken->name[i] != '.')
                        wholeNumber = wholeNumber * 10 + (ppToken->name[i] - '0');
                }
            }
            decimalShift = firstDecimal - endNonZeroDecimal;
        }
    }

    // Exponent:
    bool negativeExponent = false;
    double exponentValue = 0.0;
    int exponent = 0;
    {
        if (ch == 'e' || ch == 'E') {
            hasDecimalOrExponent = true;
            saveName(ch);
            ch = getChar();
            if (ch == '+' || ch == '-') {
                negativeExponent = ch == '-';
                saveName(ch);
                ch = getChar();
            }
            if (ch >= '0' && ch <= '9') {
                while (ch >= '0' && ch <= '9') {
                    if (exponent < 500) {
                        exponent = exponent * 10 + (ch - '0');
                    }
                    saveName(ch);
                    ch = getChar();
                }
            } else {
                parseContext.ppError(ppToken->loc, "bad character in float exponent", "", "");
            }
        }

        // Compensate for location of decimal
        if (negativeExponent)
            exponent -= decimalShift;
        else {
            exponent += decimalShift;
            if (exponent < 0) {
                negativeExponent = true;
                exponent = -exponent;
            }
        }
        if (exponent > 22)
            fastPath = false;

        if (fastPath) {
            // Compute the floating-point value of the exponent
            exponentValue = 1.0;
            if (exponent > 0) {
                double expFactor = 10;
                while (exponent > 0) {
                    if (exponent & 0x1)
                        exponentValue *= expFactor;
                    expFactor *= expFactor;
                    exponent >>= 1;
                }
            }
        }
    }

    // Suffix:
    bool isDouble = false;
    bool isFloat16 = false;
    if (ch == 'l' || ch == 'L') {
        if (ifdepth == 0 && parseContext.intermediate.getSource() == EShSourceGlsl)
            parseContext.doubleCheck(ppToken->loc, "double floating-point suffix");
        if (ifdepth == 0 && !hasDecimalOrExponent)
            parseContext.ppError(ppToken->loc, "float literal needs a decimal point or exponent", "", "");
        if (parseContext.intermediate.getSource() == EShSourceGlsl) {
            int ch2 = getChar();
            if (ch2 != 'f' && ch2 != 'F') {
                ungetChar();
                ungetChar();
            } else {
                saveName(ch);
                saveName(ch2);
                isDouble = true;
            }
        } else if (parseContext.intermediate.getSource() == EShSourceHlsl) {
            saveName(ch);
            isDouble = true;
        }
    } else if (ch == 'h' || ch == 'H') {
        if (ifdepth == 0 && parseContext.intermediate.getSource() == EShSourceGlsl)
            parseContext.float16Check(ppToken->loc, "half floating-point suffix");
        if (ifdepth == 0 && !hasDecimalOrExponent)
            parseContext.ppError(ppToken->loc, "float literal needs a decimal point or exponent", "", "");
        if (parseContext.intermediate.getSource() == EShSourceGlsl) {
            int ch2 = getChar();
            if (ch2 != 'f' && ch2 != 'F') {
                ungetChar();
                ungetChar();
            } else {
                saveName(ch);
                saveName(ch2);
                isFloat16 = true;
            }
        } else if (parseContext.intermediate.getSource() == EShSourceHlsl) {
            saveName(ch);
            isFloat16 = true;
        }
    } else
    if (ch == 'f' || ch == 'F') {
        if (ifdepth == 0)
            parseContext.profileRequires(ppToken->loc,  EEsProfile, 300, nullptr, "floating-point suffix");
        if (ifdepth == 0 && !parseContext.relaxedErrors())
            parseContext.profileRequires(ppToken->loc, ~EEsProfile, 120, nullptr, "floating-point suffix");
        if (ifdepth == 0 && !hasDecimalOrExponent)
            parseContext.ppError(ppToken->loc, "float literal needs a decimal point or exponent", "", "");
        saveName(ch);
    } else
        ungetChar();

    // Patch up the name and length for overflow

    if (len > MaxTokenLength) {
        len = MaxTokenLength;
        parseContext.ppError(ppToken->loc, "float literal too long", "", "");
    }
    ppToken->name[len] = '\0';

    // Compute the numerical value
    if (fastPath) {
        // compute the floating-point value of the exponent
        if (exponentValue == 0.0)
            ppToken->dval = (double)wholeNumber;
        else if (negativeExponent)
            ppToken->dval = (double)wholeNumber / exponentValue;
        else
            ppToken->dval = (double)wholeNumber * exponentValue;
    } else {
        // slow path
        ppToken->dval = 0.0;

        // remove suffix
        TString numstr(ppToken->name);
        if (numstr.back() == 'f' || numstr.back() == 'F')
            numstr.pop_back();
        if (numstr.back() == 'h' || numstr.back() == 'H')
            numstr.pop_back();
        if (numstr.back() == 'l' || numstr.back() == 'L')
            numstr.pop_back();

        // use platform library
        strtodStream.clear();
        strtodStream.str(numstr.c_str());
        strtodStream >> ppToken->dval;
        if (strtodStream.fail()) {
            // Assume failure combined with a large exponent was overflow, in
            // an attempt to set INF.
            if (!negativeExponent && exponent + numWholeNumberDigits > 300)
                ppToken->i64val = 0x7ff0000000000000; // +Infinity
            // Assume failure combined with a small exponent was overflow.
            if (negativeExponent && exponent + numWholeNumberDigits > 300)
                ppToken->dval = 0.0;
            // Unknown reason for failure. Theory is that either
            //  - the 0.0 is still there, or
            //  - something reasonable was written that is better than 0.0
        }
    }

    // Return the right token type
    if (isDouble)
        return PpAtomConstDouble;
    else if (isFloat16)
        return PpAtomConstFloat16;
    else
        return PpAtomConstFloat;
}